

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::SplineLoader::end__spline(SplineLoader *this)

{
  this->mInSpline = false;
  loadPositions(this);
  loadOutTangents(this);
  loadInTangents(this);
  loadInterpolations(this);
  FilePartLoader::finish((FilePartLoader *)this);
  return true;
}

Assistant:

bool SplineLoader::end__spline()
    {
        mInSpline = false;

        loadPositions();
        loadOutTangents();
        loadInTangents();
        loadInterpolations();

        // The mesh will be written by the GeometyLoader. Therefore nothing to with the mesh here
        finish();
        return true;
    }